

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O0

void __thiscall TilePool::debugPrintInfo(TilePool *this)

{
  format_string_t<unsigned_long> fmt;
  unsigned_long_long *puVar1;
  unsigned_long *args;
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  *in_RDI;
  size_t i;
  unsigned_long *in_stack_ffffffffffffff90;
  unsigned_long_long *args_2;
  size_t in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  unsigned_long_long *local_48;
  basic_string_view<char> local_38;
  char *local_20;
  basic_string_view<char> *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  
  local_18 = &local_38;
  local_20 = "TilePool info: pool has {} items";
  ::fmt::v11::basic_string_view<char>::basic_string_view
            (local_18,"TilePool info: pool has {} items",0x20);
  std::
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  ::size(in_RDI);
  fmt.str.size_ = in_stack_ffffffffffffffa0;
  fmt.str.data_ = (char *)in_RDI;
  spdlog::debug<unsigned_long>(fmt,in_stack_ffffffffffffff90);
  local_48 = (unsigned_long_long *)0x0;
  while( true ) {
    args_2 = local_48;
    puVar1 = (unsigned_long_long *)
             std::
             vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
             ::size(in_RDI);
    if (puVar1 <= args_2) break;
    local_8 = (basic_string_view<char> *)&stack0xffffffffffffffa8;
    local_10 = "  item {}: {} allocated, {:#018x}";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_8,"  item {}: {} allocated, {:#018x}",0x21);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1),
               (size_type)local_48);
    std::
    vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
    ::operator[](in_RDI,(size_type)local_48);
    std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::operator->
              ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)0x279dc6)
    ;
    args = (unsigned_long *)std::bitset<64UL>::to_ullong((bitset<64UL> *)0x279dd5);
    spdlog::debug<unsigned_long&,unsigned_int&,unsigned_long_long>
              ((format_string_t<unsigned_long_&,_unsigned_int_&,_unsigned_long_long>)
               in_stack_ffffffffffffffa8,args,(uint *)in_RDI,args_2);
    local_48 = (unsigned_long_long *)((long)local_48 + 1);
  }
  return;
}

Assistant:

void TilePool::debugPrintInfo() {
    /*spdlog::debug("TilePool info: pool has {} items, baseId = {}, upperId = {}", items_.size(), baseId_, upperId_);
    for (size_t i = 0; i < items_.size(); ++i) {
        if (items_[i] == nullptr) {
            spdlog::debug("  item {}: null", i);
        } else {
            spdlog::debug("  item {}: {} allocated", i, items_[i]->allocatedCount);
        }
    }*/

    spdlog::debug("TilePool info: pool has {} items", items_.size());
    for (size_t i = 0; i < items_.size(); ++i) {
        spdlog::debug("  item {}: {} allocated, {:#018x}", i, itemsAllocatedCount_[i], items_[i]->allocated.to_ullong());
    }
}